

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_standard_tests.cpp
# Opt level: O3

void __thiscall
script_standard_tests::bip341_spk_test_vectors::test_method(bip341_spk_test_vectors *this)

{
  string *key;
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  *pmVar1;
  pointer pUVar2;
  element_type *__n;
  undefined4 uVar3;
  CScript *pCVar4;
  int iVar5;
  UniValue *pUVar6;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar7;
  string *psVar8;
  uchar *puVar9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  size_t in_RCX;
  iterator in_R8;
  iterator pvVar12;
  iterator in_R9;
  iterator pvVar13;
  long in_FS_OFFSET;
  readonly_property<bool> rVar14;
  bool bVar15;
  string_view hex_str;
  const_string file;
  Span<const_unsigned_char> s;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  Span<const_unsigned_char> s_00;
  const_string file_03;
  const_string file_04;
  string_view hex_str_00;
  initializer_list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __l;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar16;
  UniValue *local_3e0;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  long *local_300;
  undefined8 local_2f8;
  code *local_2f0;
  code *local_2e8;
  string *local_2e0;
  shared_count local_2d8;
  char *local_2d0;
  undefined1 local_2c8 [16];
  undefined1 auStack_2b8 [8];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  size_t local_280;
  TaprootSpendData spend_data;
  string local_208;
  string local_1e8;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_178;
  undefined1 local_168 [8];
  bool local_160;
  undefined7 uStack_15f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
  scriptposes;
  TaprootBuilder spktest;
  UniValue tests;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tests.val._M_dataplus._M_p = (pointer)&tests.val.field_2;
  tests.val._M_string_length = 0;
  tests.val.field_2._M_local_buf[0] = '\0';
  tests.typ = VNULL;
  tests.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tests.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tests.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::UniValue::read(&tests,0x7270,json_tests::detail_bip341_wallet_vectors_bytes,in_RCX);
  spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ =
       spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&spend_data,"scriptPubKey","");
  pUVar6 = ::UniValue::operator[](&tests,(string *)&spend_data);
  if ((uchar *)spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems.
                            _0_8_,
                    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ +
                    1);
  }
  pvVar7 = ::UniValue::getValues(pUVar6);
  local_3e0 = (pvVar7->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_start;
  pUVar2 = (pvVar7->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_3e0 != pUVar2) {
    key = (string *)(local_2b0 + 8);
    do {
      spktest.m_valid = true;
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      spktest.m_branch.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      spktest.m_branch.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      spktest.m_branch.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      scriptposes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      scriptposes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      scriptposes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &scriptposes._M_t._M_impl.super__Rb_tree_header._M_header;
      scriptposes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_2f8 = 0;
      scriptposes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           scriptposes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_300 = (long *)operator_new(0x18);
      *local_300 = (long)&scriptposes;
      local_300[1] = (long)&spktest;
      local_300[2] = (long)&local_300;
      local_2e8 = std::
                  _Function_handler<void_(const_UniValue_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp:424:65)>
                  ::_M_invoke;
      local_2f0 = std::
                  _Function_handler<void_(const_UniValue_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp:424:65)>
                  ::_M_manager;
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ =
           spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&spend_data,"given","");
      pUVar6 = ::UniValue::operator[](local_3e0,(string *)&spend_data);
      local_2b0._8_8_ = &local_298;
      std::__cxx11::string::_M_construct<char_const*>((string *)key,"scriptTree","");
      pUVar6 = ::UniValue::operator[](pUVar6,key);
      local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
      if (local_2f0 == (code *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_function_call();
LAB_005bfd6b:
          __assert_fail("vch.size() == WIDTH",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/uint256.h"
                        ,0x2a,"base_blob<256>::base_blob(Span<const unsigned char>) [BITS = 256]");
        }
        goto LAB_005c0363;
      }
      (*local_2e8)(&local_300,pUVar6,local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._8_8_ != &local_298) {
        operator_delete((void *)local_2b0._8_8_,(ulong)(local_298._M_allocated_capacity + 1));
      }
      if ((uchar *)spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ !=
          spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10) {
        operator_delete((void *)spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data.
                                _M_elems._0_8_,
                        spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems.
                        _16_8_ + 1);
      }
      local_2b0._8_8_ = &local_298;
      std::__cxx11::string::_M_construct<char_const*>((string *)key,"given","");
      pUVar6 = ::UniValue::operator[](local_3e0,key);
      local_58._0_8_ = &local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"internalPubkey","");
      pUVar6 = ::UniValue::operator[](pUVar6,(string *)local_58);
      psVar8 = ::UniValue::get_str_abi_cxx11_(pUVar6);
      hex_str._M_str = (psVar8->_M_dataplus)._M_p;
      hex_str._M_len = psVar8->_M_string_length;
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168,hex_str);
      if (CONCAT71(uStack_15f,local_160) - (long)local_168 != 0x20) goto LAB_005bfd6b;
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)local_168;
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(_func_int **)((long)local_168 + 8);
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(_func_int **)((long)local_168 + 0x10);
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(_func_int **)((long)local_168 + 0x18);
      TaprootBuilder::Finalize(&spktest,&spend_data.internal_key);
      if (local_168 != (undefined1  [8])0x0) {
        operator_delete((void *)local_168,local_158._M_allocated_capacity - (long)local_168);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._8_8_ != &local_298) {
        operator_delete((void *)local_2b0._8_8_,(ulong)(local_298._M_allocated_capacity + 1));
      }
      local_310 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
      ;
      local_308 = "";
      local_320 = &boost::unit_test::basic_cstring<char_const>::null;
      local_318 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x1b7;
      file.m_begin = (iterator)&local_310;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_320,msg)
      ;
      local_160 = false;
      local_168 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
      local_158._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_158._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      TaprootBuilder::GetOutput((WitnessV1Taproot *)local_1c8,&spktest);
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_1c8[0x10];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_1c8[0x11];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_1c8[0x12];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_1c8[0x13];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_1c8[0x14];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_1c8[0x15];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_1c8[0x16];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_1c8[0x17];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] =
           local_1c8[0x18];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] =
           local_1c8[0x19];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] =
           local_1c8[0x1a];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] =
           local_1c8[0x1b];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] =
           local_1c8[0x1c];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] =
           local_1c8[0x1d];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] =
           local_1c8[0x1e];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] =
           local_1c8[0x1f];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = local_1c8[0];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = local_1c8[1];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = local_1c8[2];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = local_1c8[3];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = local_1c8[4];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = local_1c8[5];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = local_1c8[6];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = local_1c8[7];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = local_1c8[8];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = local_1c8[9];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = local_1c8[10];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = local_1c8[0xb];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = local_1c8[0xc];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = local_1c8[0xd];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = local_1c8[0xe];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = local_1c8[0xf];
      spend_data.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 6;
      GetScriptForDestination((CScript *)local_1a8,(CTxDestination *)&spend_data);
      uVar3 = local_198._12_4_ - 0x1d;
      pCVar4 = (CScript *)local_1a8._0_8_;
      if ((uint)local_198._12_4_ < 0x1d) {
        uVar3 = local_198._12_4_;
        pCVar4 = (CScript *)local_1a8;
      }
      s.m_size._0_4_ = uVar3;
      s.m_data = (uchar *)pCVar4;
      s.m_size._4_4_ = 0;
      HexStr_abi_cxx11_((string *)local_188,s);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"expected","");
      pUVar6 = ::UniValue::operator[](local_3e0,&local_1e8);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"scriptPubKey","");
      pUVar6 = ::UniValue::operator[](pUVar6,&local_208);
      psVar8 = ::UniValue::get_str_abi_cxx11_(pUVar6);
      if ((element_type *)local_188._8_8_ == (element_type *)psVar8->_M_string_length) {
        if ((element_type *)local_188._8_8_ == (element_type *)0x0) {
          rVar14.super_class_property<bool>.value = (class_property<bool>)true;
        }
        else {
          iVar5 = bcmp((void *)local_188._0_8_,(psVar8->_M_dataplus)._M_p,local_188._8_8_);
          rVar14.super_class_property<bool>.value = (class_property<bool>)(iVar5 == 0);
        }
      }
      else {
        rVar14.super_class_property<bool>.value = (class_property<bool>)false;
      }
      local_2c8[0] = rVar14.super_class_property<bool>.value;
      local_2c8._8_8_ = (element_type *)0x0;
      auStack_2b8 = (undefined1  [8])0x0;
      local_2d8.pi_ = (sp_counted_base *)0xea4a2f;
      local_2d0 = "";
      local_2b0._0_8_ = local_188;
      local_2a0[0] = '\0';
      local_2b0._8_8_ = &PTR__lazy_ostream_01388fc8;
      local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_298._8_8_ = local_2b0;
      local_58[8] = 0;
      local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_48._8_8_ = &local_2e0;
      pvVar12 = (iterator)0x1;
      pvVar13 = (iterator)0x2;
      local_2e0 = psVar8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_2c8,(lazy_ostream *)local_168,1,2,REQUIRE,0xea5cfb,
                 (size_t)&local_2d8,0x1b7,key,"vec[\"expected\"][\"scriptPubKey\"].get_str()",
                 local_58);
      boost::detail::shared_count::~shared_count((shared_count *)auStack_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._0_8_ != &aStack_178) {
        operator_delete((void *)local_188._0_8_,(ulong)(aStack_178._M_allocated_capacity + 1));
      }
      if (0x1c < (uint)local_198._12_4_) {
        free((void *)local_1a8._0_8_);
        local_1a8._0_8_ = (CScript *)0x0;
      }
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&spend_data);
      local_330 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
      ;
      local_328 = "";
      local_340 = &boost::unit_test::basic_cstring<char_const>::null;
      local_338 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x1b8;
      file_00.m_begin = (iterator)&local_330;
      msg_00.m_end = pvVar13;
      msg_00.m_begin = pvVar12;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_340,
                 msg_00);
      local_160 = false;
      local_168 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
      local_158._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_158._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      TaprootBuilder::GetOutput((WitnessV1Taproot *)local_1a8,&spktest);
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_198._M_local_buf[0];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_198._M_local_buf[1];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_198._M_local_buf[2];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_198._M_local_buf[3];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_198._M_local_buf[4];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_198._M_local_buf[5];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_198._M_local_buf[6];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_198._M_local_buf[7];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = local_1a8[0];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = local_1a8[1];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = local_1a8[2];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = local_1a8[3];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = local_1a8[4];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = local_1a8[5];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = local_1a8[6];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = local_1a8[7];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = local_1a8[8];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = local_1a8[9];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = local_1a8[10];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = local_1a8[0xb];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = local_1a8[0xc];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = local_1a8[0xd];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = local_1a8[0xe];
      spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = local_1a8[0xf];
      spend_data.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 6;
      EncodeDestination_abi_cxx11_((string *)local_188,(CTxDestination *)&spend_data);
      local_1c8._0_8_ = local_1c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"expected","");
      pUVar6 = ::UniValue::operator[](local_3e0,(string *)local_1c8);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"bip350Address","");
      pUVar6 = ::UniValue::operator[](pUVar6,&local_1e8);
      psVar8 = ::UniValue::get_str_abi_cxx11_(pUVar6);
      if ((element_type *)local_188._8_8_ == (element_type *)psVar8->_M_string_length) {
        if ((element_type *)local_188._8_8_ == (element_type *)0x0) {
          bVar15 = true;
        }
        else {
          iVar5 = bcmp((void *)local_188._0_8_,(psVar8->_M_dataplus)._M_p,local_188._8_8_);
          bVar15 = iVar5 == 0;
        }
      }
      else {
        bVar15 = false;
      }
      local_208._M_dataplus._M_p._0_1_ = bVar15;
      local_208._M_string_length = 0;
      local_208.field_2._M_allocated_capacity = 0;
      local_2c8._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
      ;
      local_2c8._8_8_ = "";
      local_2d8.pi_ = (sp_counted_base *)local_188;
      local_2a0[0] = '\0';
      local_2b0._8_8_ = &PTR__lazy_ostream_01388fc8;
      local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_298._8_8_ = &local_2d8;
      local_58[8] = 0;
      local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_48._8_8_ = local_2b0;
      pvVar12 = (iterator)0x1;
      pvVar13 = (iterator)0x2;
      local_2b0._0_8_ = psVar8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_208,(lazy_ostream *)local_168,1,2,REQUIRE,0xea5d5a,
                 (size_t)local_2c8,0x1b8,key,"vec[\"expected\"][\"bip350Address\"].get_str()",
                 local_58);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_208.field_2._M_allocated_capacity);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._0_8_ != &aStack_178) {
        operator_delete((void *)local_188._0_8_,(ulong)(aStack_178._M_allocated_capacity + 1));
      }
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&spend_data);
      TaprootBuilder::GetSpendData(&spend_data,&spktest);
      local_350 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
      ;
      local_348 = "";
      local_360 = &boost::unit_test::basic_cstring<char_const>::null;
      local_358 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x1ba;
      file_01.m_begin = (iterator)&local_350;
      msg_01.m_end = pvVar13;
      msg_01.m_begin = pvVar12;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_360,
                 msg_01);
      local_160 = false;
      local_168 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
      local_158._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_158._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_188._0_8_ = &aStack_178;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"intermediary","");
      pUVar6 = ::UniValue::operator[](local_3e0,(string *)local_188);
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"merkleRoot","");
      pUVar6 = ::UniValue::operator[](pUVar6,(string *)local_1a8);
      local_2d8.pi_._0_1_ = pUVar6->typ == VNULL;
      pmVar1 = &spend_data.scripts;
      puVar9 = std::
               __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                         (&spend_data.merkle_root,pmVar1);
      local_2b0[0] = (map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                      *)puVar9 == pmVar1;
      local_1c8[0] = (bool)(char)local_2d8.pi_ ==
                     ((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                       *)puVar9 == pmVar1);
      local_1c8._8_8_ = (element_type *)0x0;
      local_1c8._16_8_ = 0;
      local_1e8._M_dataplus._M_p =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
      ;
      local_1e8._M_string_length = 0xea4a9d;
      local_208._M_dataplus._M_p = (pointer)&local_2d8;
      local_2a0[0] = '\0';
      local_2b0._8_8_ = &PTR__lazy_ostream_01389268;
      local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_298._8_8_ = &local_208;
      local_2c8._0_8_ = local_2b0;
      local_58[8] = 0;
      local_58._0_8_ = &PTR__lazy_ostream_01389268;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_48._8_8_ = local_2c8;
      pvVar12 = (iterator)0x1;
      pvVar13 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1c8,(lazy_ostream *)local_168,1,2,REQUIRE,0xea5dd2,
                 (size_t)&local_1e8,0x1ba,key,"spend_data.merkle_root.IsNull()",local_58);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 0x10));
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._0_8_ != &aStack_178) {
        operator_delete((void *)local_188._0_8_,(ulong)(aStack_178._M_allocated_capacity + 1));
      }
      puVar9 = std::
               __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                         (&spend_data.merkle_root,&spend_data.scripts);
      if ((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
           *)puVar9 != &spend_data.scripts) {
        local_370 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
        ;
        local_368 = "";
        local_380 = &boost::unit_test::basic_cstring<char_const>::null;
        local_378 = &boost::unit_test::basic_cstring<char_const>::null;
        file_02.m_end = (iterator)0x1bc;
        file_02.m_begin = (iterator)&local_370;
        msg_02.m_end = pvVar13;
        msg_02.m_begin = pvVar12;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_380
                   ,msg_02);
        local_160 = false;
        local_168 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
        local_158._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_158._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_188._0_8_ = &aStack_178;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"intermediary","");
        pUVar6 = ::UniValue::operator[](local_3e0,(string *)local_188);
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"merkleRoot","");
        pUVar6 = ::UniValue::operator[](pUVar6,(string *)local_1a8);
        psVar8 = ::UniValue::get_str_abi_cxx11_(pUVar6);
        s_00.m_size = 0x20;
        s_00.m_data = (uchar *)&spend_data.merkle_root;
        HexStr_abi_cxx11_((string *)local_1c8,s_00);
        __n = (element_type *)psVar8->_M_string_length;
        if (__n == (element_type *)local_1c8._8_8_) {
          if (__n == (element_type *)0x0) {
            bVar15 = true;
          }
          else {
            iVar5 = bcmp((psVar8->_M_dataplus)._M_p,(void *)local_1c8._0_8_,(size_t)__n);
            bVar15 = iVar5 == 0;
          }
        }
        else {
          bVar15 = false;
        }
        local_1e8._M_dataplus._M_p._0_1_ = bVar15;
        local_1e8._M_string_length = 0;
        local_1e8.field_2._M_allocated_capacity = 0;
        local_208._M_dataplus._M_p =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
        ;
        local_208._M_string_length = 0xea4a9d;
        local_2a0[0] = '\0';
        local_2b0._8_8_ = &PTR__lazy_ostream_01388fc8;
        local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_298._8_8_ = local_2c8;
        local_2d8.pi_ = (sp_counted_base *)local_1c8;
        local_58[8] = 0;
        local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = &local_2d8;
        pvVar12 = (iterator)0x1;
        pvVar13 = (iterator)0x2;
        local_2c8._0_8_ = psVar8;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_1e8,(lazy_ostream *)local_168,1,2,REQUIRE,0xea5e1d,
                   (size_t)&local_208,0x1bc,key,"HexStr(spend_data.merkle_root)",local_58);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&local_1e8.field_2._M_allocated_capacity);
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        }
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._0_8_ != &aStack_178) {
          operator_delete((void *)local_188._0_8_,(ulong)(aStack_178._M_allocated_capacity + 1));
        }
      }
      local_390 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
      ;
      local_388 = "";
      local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_398 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x1be;
      file_03.m_begin = (iterator)&local_390;
      msg_03.m_end = pvVar13;
      msg_03.m_begin = pvVar12;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3a0,
                 msg_03);
      local_160 = false;
      local_168 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
      local_158._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_158._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_208._M_dataplus._M_p =
           (pointer)spend_data.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_2c8._0_8_ = scriptposes._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_188[0] = spend_data.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                     scriptposes._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_188._8_8_ = (element_type *)0x0;
      aStack_178._M_allocated_capacity = 0;
      local_1a8._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
      ;
      local_1a8._8_8_ =
           (long)
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
           + 0x6e;
      local_1c8._0_8_ = &local_208;
      local_2a0[0] = '\0';
      local_2b0._8_8_ = &PTR__lazy_ostream_01388f48;
      local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_298._8_8_ = local_1c8;
      local_1e8._M_dataplus._M_p = local_2c8;
      local_58[8] = 0;
      local_58._0_8_ = &PTR__lazy_ostream_01388f48;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_48._8_8_ = &local_1e8;
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_188,(lazy_ostream *)local_168,1,2,REQUIRE,0xea5e68,
                 (size_t)local_1a8,0x1be,key,"scriptposes.size()",local_58);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_178._M_allocated_capacity);
      for (p_Var11 = scriptposes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var11 != &scriptposes._M_t._M_impl.super__Rb_tree_header;
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var11)) {
        local_3b0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
        ;
        local_3a8 = "";
        local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_04.m_end = (iterator)0x1c0;
        file_04.m_begin = (iterator)&local_3b0;
        msg_04.m_end = in_R9;
        msg_04.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3c0
                   ,msg_04);
        pmVar10 = std::
                  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                  ::operator[](&spend_data.scripts,(key_type *)(p_Var11 + 1));
        local_58._0_8_ = &local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"expected","");
        pUVar6 = ::UniValue::operator[](local_3e0,(string *)local_58);
        local_168 = (undefined1  [8])&local_158;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_168,"scriptPathControlBlocks","");
        pUVar6 = ::UniValue::operator[](pUVar6,(string *)local_168);
        pUVar6 = ::UniValue::operator[](pUVar6,(long)(int)p_Var11[2]._M_color);
        psVar8 = ::UniValue::get_str_abi_cxx11_(pUVar6);
        hex_str_00._M_str = (psVar8->_M_dataplus)._M_p;
        hex_str_00._M_len = psVar8->_M_string_length;
        ParseHex<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,hex_str_00);
        _cVar16 = 0x5bfb16;
        __l._M_len = 1;
        __l._M_array = (iterator)local_1c8;
        std::
        set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::set((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)key,__l,(ShortestVectorFirstComparator *)&local_208,(allocator_type *)local_2c8);
        if ((pmVar10->_M_t)._M_impl.super__Rb_tree_header._M_node_count == local_280) {
          _cVar16 = 0x5bfb3c;
          bVar15 = std::__equal<false>::
                   equal<std::_Rb_tree_const_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Rb_tree_const_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                             ((pmVar10->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                              (_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               )&(pmVar10->_M_t)._M_impl.super__Rb_tree_header,
                              (_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               )local_298._8_8_);
        }
        else {
          bVar15 = false;
        }
        local_1a8[0] = bVar15;
        local_1a8._8_8_ = (char *)0x0;
        local_198._M_allocated_capacity = 0;
        local_1e8._M_dataplus._M_p =
             "spend_data.scripts[scriptpos.first] == control_set{ParseHex(vec[\"expected\"][\"scriptPathControlBlocks\"][scriptpos.second].get_str())}"
        ;
        local_1e8._M_string_length = 0xea5f31;
        local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
        local_188._0_8_ = &PTR__lazy_ostream_01389048;
        aStack_178._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        aStack_178._8_8_ = &local_1e8;
        local_3d0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
        ;
        local_3c8 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_1a8,(lazy_ostream *)local_188,1,0,WARN,_cVar16,
                   (size_t)&local_3d0,0x1c0);
        boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
        std::
        _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)key);
        if ((string *)local_1c8._0_8_ != (string *)0x0) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
        }
        if (local_168 != (undefined1  [8])&local_158) {
          operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._0_8_ != &local_48) {
          operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
        }
      }
      std::
      _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
      ::~_Rb_tree(&spend_data.scripts._M_t);
      if (local_2f0 != (code *)0x0) {
        (*local_2f0)(&local_300,&local_300,3);
      }
      std::
      _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
      ::~_Rb_tree(&scriptposes._M_t);
      std::
      vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ::~vector(&spktest.m_branch);
      local_3e0 = local_3e0 + 1;
    } while (local_3e0 != pUVar2);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&tests.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tests.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tests.val._M_dataplus._M_p != &tests.val.field_2) {
    operator_delete(tests.val._M_dataplus._M_p,
                    CONCAT71(tests.val.field_2._M_allocated_capacity._1_7_,
                             tests.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005c0363:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bip341_spk_test_vectors)
{
    using control_set = decltype(TaprootSpendData::scripts)::mapped_type;

    UniValue tests;
    tests.read(json_tests::bip341_wallet_vectors);

    const auto& vectors = tests["scriptPubKey"];

    for (const auto& vec : vectors.getValues()) {
        TaprootBuilder spktest;
        std::map<std::pair<std::vector<unsigned char>, int>, int> scriptposes;
        std::function<void (const UniValue&, int)> parse_tree = [&](const UniValue& node, int depth) {
            if (node.isNull()) return;
            if (node.isObject()) {
                auto script = ParseHex(node["script"].get_str());
                int idx = node["id"].getInt<int>();
                int leaf_version = node["leafVersion"].getInt<int>();
                scriptposes[{script, leaf_version}] = idx;
                spktest.Add(depth, script, leaf_version);
            } else {
                parse_tree(node[0], depth + 1);
                parse_tree(node[1], depth + 1);
            }
        };
        parse_tree(vec["given"]["scriptTree"], 0);
        spktest.Finalize(XOnlyPubKey(ParseHex(vec["given"]["internalPubkey"].get_str())));
        BOOST_CHECK_EQUAL(HexStr(GetScriptForDestination(spktest.GetOutput())), vec["expected"]["scriptPubKey"].get_str());
        BOOST_CHECK_EQUAL(EncodeDestination(spktest.GetOutput()), vec["expected"]["bip350Address"].get_str());
        auto spend_data = spktest.GetSpendData();
        BOOST_CHECK_EQUAL(vec["intermediary"]["merkleRoot"].isNull(), spend_data.merkle_root.IsNull());
        if (!spend_data.merkle_root.IsNull()) {
            BOOST_CHECK_EQUAL(vec["intermediary"]["merkleRoot"].get_str(), HexStr(spend_data.merkle_root));
        }
        BOOST_CHECK_EQUAL(spend_data.scripts.size(), scriptposes.size());
        for (const auto& scriptpos : scriptposes) {
            BOOST_CHECK(spend_data.scripts[scriptpos.first] == control_set{ParseHex(vec["expected"]["scriptPathControlBlocks"][scriptpos.second].get_str())});
        }
    }
}